

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapInsertIntKey(jx9_hashmap *pMap,sxi64 iKey,jx9_value *pValue)

{
  sxu32 sVar1;
  sxi32 sVar2;
  undefined8 in_RAX;
  jx9_value *pDest;
  jx9_hashmap_node *pNode;
  sxi32 sVar3;
  sxu32 nIdx;
  
  nIdx = (sxu32)((ulong)in_RAX >> 0x20);
  pDest = jx9VmReserveMemObj(pMap->pVm,&nIdx);
  sVar3 = -1;
  if (pDest != (jx9_value *)0x0) {
    if (pValue != (jx9_value *)0x0) {
      jx9MemObjStore(pValue,pDest);
    }
    sVar1 = (*pMap->xIntHash)(iKey);
    pNode = (jx9_hashmap_node *)SyMemBackendPoolAlloc(&pMap->pVm->sAllocator,0x60);
    if (pNode != (jx9_hashmap_node *)0x0) {
      SyZero(pNode,0x60);
      pNode->pMap = pMap;
      pNode->iType = 1;
      pNode->nHash = sVar1;
      (pNode->xKey).iKey = iKey;
      pNode->nValIdx = nIdx;
      sVar2 = HashmapGrowBucket(pMap);
      if (sVar2 == 0) {
        HashmapNodeLink(pMap,pNode,pMap->nSize - 1 & sVar1);
        sVar3 = 0;
      }
      else {
        SyMemBackendPoolFree(&pMap->pVm->sAllocator,pNode);
      }
    }
  }
  return sVar3;
}

Assistant:

static sxi32 HashmapInsertIntKey(jx9_hashmap *pMap,sxi64 iKey,jx9_value *pValue)
{
	jx9_hashmap_node *pNode;
	jx9_value *pObj;
	sxu32 nIdx;
	sxu32 nHash;
	sxi32 rc;
	/* Reserve a jx9_value for the value */
	pObj = jx9VmReserveMemObj(pMap->pVm,&nIdx);
	if( pObj == 0 ){
		return SXERR_MEM;
	}
	if( pValue ){
		/* Duplicate the value */
		jx9MemObjStore(pValue, pObj);
	}	
	/* Hash the key */
	nHash = pMap->xIntHash(iKey);
	/* Allocate a new int node */
	pNode = HashmapNewIntNode(&(*pMap), iKey, nHash, nIdx);
	if( pNode == 0 ){
		return SXERR_MEM;
	}
	/* Make sure the bucket is big enough to hold the new entry */
	rc = HashmapGrowBucket(&(*pMap));
	if( rc != SXRET_OK ){
		SyMemBackendPoolFree(&pMap->pVm->sAllocator, pNode);
		return rc;
	}
	/* Perform the insertion */
	HashmapNodeLink(&(*pMap), pNode, nHash & (pMap->nSize - 1));
	/* All done */
	return SXRET_OK;
}